

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlNodeSetPtr xmlXPathIntersection(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  uint uVar1;
  int iVar2;
  xmlNodeSetPtr cur;
  ulong uVar3;
  xmlNodePtr val;
  ulong uVar4;
  
  cur = xmlXPathNodeSetCreate((xmlNodePtr)0x0);
  if (((((nodes1 != (xmlNodeSetPtr)0x0 && cur != (xmlNodeSetPtr)0x0) &&
        (uVar1 = nodes1->nodeNr, uVar1 != 0)) && (nodes2 != (xmlNodeSetPtr)0x0)) &&
      ((nodes1->nodeTab != (xmlNodePtr *)0x0 && (nodes2->nodeNr != 0)))) &&
     (nodes2->nodeTab != (xmlNodePtr *)0x0)) {
    uVar3 = 0;
    uVar4 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      if ((long)uVar3 < (long)nodes1->nodeNr) {
        val = nodes1->nodeTab[uVar3];
      }
      else {
        val = (xmlNodePtr)0x0;
      }
      iVar2 = xmlXPathNodeSetContains(nodes2,val);
      if ((iVar2 != 0) && (iVar2 = xmlXPathNodeSetAddUnique(cur,val), iVar2 < 0)) {
        return cur;
      }
    }
  }
  return cur;
}

Assistant:

xmlNodeSetPtr
xmlXPathIntersection (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    xmlNodeSetPtr ret = xmlXPathNodeSetCreate(NULL);
    int i, l1;
    xmlNodePtr cur;

    if (ret == NULL)
        return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes1))
	return(ret);
    if (xmlXPathNodeSetIsEmpty(nodes2))
	return(ret);

    l1 = xmlXPathNodeSetGetLength(nodes1);

    for (i = 0; i < l1; i++) {
	cur = xmlXPathNodeSetItem(nodes1, i);
	if (xmlXPathNodeSetContains(nodes2, cur)) {
            /* TODO: Propagate memory error. */
	    if (xmlXPathNodeSetAddUnique(ret, cur) < 0)
	        break;
	}
    }
    return(ret);
}